

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::
emplaceRealloc<(anonymous_namespace)::Constructable_const&>
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,pointer pos,
          Constructable *args)

{
  ulong uVar1;
  pointer pCVar2;
  ulong uVar3;
  uint uVar4;
  pointer ctx;
  int iVar5;
  int *piVar6;
  pointer pCVar7;
  pointer pCVar8;
  long lVar9;
  
  if (this->len != 0xfffffffffffffff) {
    uVar3 = this->len + 1;
    uVar1 = this->cap;
    if (uVar3 < uVar1 * 2) {
      uVar3 = uVar1 * 2;
    }
    if (0xfffffffffffffff - uVar1 < uVar1) {
      uVar3 = 0xfffffffffffffff;
    }
    lVar9 = (long)pos - (long)this->data_;
    pCVar2 = (pointer)operator_new(uVar3 * 8);
    iVar5 = args->value;
    *(undefined1 *)((long)pCVar2 + lVar9) = 1;
    *(int *)((long)pCVar2 + lVar9 + 4) = iVar5;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
    ctx = this->data_;
    pCVar7 = ctx + this->len;
    if (pCVar7 == pos) {
      if (this->len != 0) {
        iVar5 = 0;
        pCVar7 = pCVar2;
        do {
          pCVar7->constructed = true;
          pCVar7->value = ctx->value;
          ctx->value = 0;
          ctx = ctx + 1;
          pCVar7 = pCVar7 + 1;
          iVar5 = iVar5 + -1;
        } while (ctx != pos);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar5;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar5;
      }
    }
    else {
      if (ctx != pos) {
        iVar5 = 0;
        pCVar8 = pCVar2;
        do {
          pCVar8->constructed = true;
          pCVar8->value = ctx->value;
          ctx->value = 0;
          ctx = ctx + 1;
          pCVar8 = pCVar8 + 1;
          iVar5 = iVar5 + -1;
        } while (ctx != pos);
        (anonymous_namespace)::Constructable::numConstructorCalls =
             (anonymous_namespace)::Constructable::numConstructorCalls - iVar5;
        (anonymous_namespace)::Constructable::numMoveConstructorCalls =
             (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar5;
      }
      piVar6 = (int *)((long)pCVar2 + lVar9 + 0xc);
      ctx = (pointer)0x0;
      do {
        *(undefined1 *)(piVar6 + -1) = 1;
        *piVar6 = pos->value;
        pos->value = 0;
        pos = pos + 1;
        piVar6 = piVar6 + 2;
        uVar4 = (int)ctx - 1;
        ctx = (pointer)(ulong)uVar4;
      } while (pos != pCVar7);
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls - uVar4;
      (anonymous_namespace)::Constructable::numMoveConstructorCalls =
           (anonymous_namespace)::Constructable::numMoveConstructorCalls - uVar4;
    }
    cleanup(this,(EVP_PKEY_CTX *)ctx);
    this->len = this->len + 1;
    this->cap = uVar3;
    this->data_ = pCVar2;
    return (pointer)((long)pCVar2 + lVar9);
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}